

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

void Ivy_FastMapRequired(Ivy_Man_t *pAig,int Delay,int fSetInter)

{
  char cVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void **ppvVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  int *piVar9;
  void *pvVar10;
  long lVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  short sVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  
  lVar13 = (long)pAig->vPis->nSize;
  if (0 < lVar13) {
    ppvVar6 = pAig->vPis->pArray;
    lVar7 = *(long *)((long)pAig->pData + 0x10);
    iVar3 = *(int *)((long)pAig->pData + 8);
    lVar16 = 0;
    do {
      lVar17 = (long)*ppvVar6[lVar16] * (long)iVar3;
      *(undefined2 *)(lVar7 + 10 + lVar17) = 10000;
      *(undefined4 *)(lVar7 + 4 + lVar17) = 0;
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
  }
  pVVar8 = pAig->vObjs;
  iVar3 = pVVar8->nSize;
  if (0 < (long)iVar3) {
    ppvVar6 = pVVar8->pArray;
    lVar13 = 0;
    do {
      piVar9 = (int *)ppvVar6[lVar13];
      if ((piVar9 != (int *)0x0) && (0xfffffffd < (piVar9[2] & 0xfU) - 7)) {
        lVar7 = *(long *)((long)pAig->pData + 0x10);
        lVar16 = (long)*(int *)((long)pAig->pData + 8) * (long)*piVar9;
        *(undefined2 *)(lVar7 + 10 + lVar16) = 10000;
        *(undefined4 *)(lVar7 + 4 + lVar16) = 0;
      }
      lVar13 = lVar13 + 1;
    } while (iVar3 != lVar13);
  }
  lVar13 = (long)pAig->vPos->nSize;
  if (0 < lVar13) {
    ppvVar6 = pAig->vPos->pArray;
    lVar7 = *(long *)((long)pAig->pData + 0x10);
    iVar4 = *(int *)((long)pAig->pData + 8);
    lVar16 = 0;
    do {
      lVar17 = (long)*(int *)(*(ulong *)((long)ppvVar6[lVar16] + 0x10) & 0xfffffffffffffffe) *
               (long)iVar4;
      *(short *)(lVar7 + 10 + lVar17) = (short)Delay;
      piVar9 = (int *)(lVar7 + 4 + lVar17);
      *piVar9 = *piVar9 + 1;
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
  }
  pvVar10 = pAig->pData;
  lVar13 = (long)*(int *)(*(long *)((long)pvVar10 + 0x18) + 4);
  if (0 < lVar13) {
    lVar7 = *(long *)(*(long *)((long)pvVar10 + 0x18) + 8);
    do {
      lVar16 = *(long *)(lVar7 + -8 + lVar13 * 8);
      lVar17 = (long)*(int *)(lVar16 + 4);
      if (0 < lVar17) {
        lVar16 = *(long *)(lVar16 + 8);
        lVar11 = *(long *)((long)pvVar10 + 0x10);
        iVar4 = *(int *)((long)pvVar10 + 8);
        lVar14 = 0;
        do {
          lVar19 = (long)**(int **)(lVar16 + lVar14 * 8) * (long)iVar4;
          if (*(int *)(lVar11 + 4 + lVar19) < 1) {
            __assert_fail("pSupp->nRefs > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                          ,0x366,"void Ivy_FastMapRequired(Ivy_Man_t *, int, int)");
          }
          pcVar20 = (char *)(lVar19 + lVar11);
          cVar1 = *pcVar20;
          if (0 < (long)cVar1) {
            lVar19 = 0;
            do {
              iVar5 = *(int *)(pcVar20 + lVar19 * 4 + 0xc);
              if (((long)iVar5 < 0) || (iVar3 <= iVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              lVar18 = (long)*pVVar8->pArray[iVar5] * (long)iVar4;
              sVar2 = *(short *)(lVar11 + 10 + lVar18);
              sVar15 = (short)(*(short *)(pcVar20 + 10) + -1);
              if ((int)sVar2 < *(short *)(pcVar20 + 10) + -1) {
                sVar15 = sVar2;
              }
              *(short *)(lVar11 + 10 + lVar18) = sVar15;
              piVar9 = (int *)(lVar11 + 4 + lVar18);
              *piVar9 = *piVar9 + 1;
              lVar19 = lVar19 + 1;
            } while (cVar1 != lVar19);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != lVar17);
      }
      bVar12 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar12);
  }
  return;
}

Assistant:

void Ivy_FastMapRequired( Ivy_Man_t * pAig, int Delay, int fSetInter )
{
    Vec_Vec_t * vLuts;
    Vec_Ptr_t * vNodes;
    Ivy_Obj_t * pObj;
    Ivy_Supp_t * pSupp, * pSuppF;
    int i, k, c;
    // clean the required times
    Ivy_ManForEachPi( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        pSupp->DelayR = IVY_INFINITY;
        pSupp->nRefs = 0;
    }
    Ivy_ManForEachNode( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        pSupp->DelayR = IVY_INFINITY;
        pSupp->nRefs = 0;
    }
    // set the required times of the POs
    Ivy_ManForEachPo( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, Ivy_ObjFanin0(pObj) );
        pSupp->DelayR = Delay;
        pSupp->nRefs++;
    }
    // get the levelized nodes used in the mapping
    vLuts = ((Ivy_SuppMan_t *)pAig->pData)->vLuts;
    // propagate the required times
    Vec_VecForEachLevelReverse( vLuts, vNodes, i )
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, k )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        assert( pSupp->nRefs > 0 );
        for ( c = 0; c < pSupp->nSize; c++ )
        {
            pSuppF = Ivy_ObjSupp( pAig, Ivy_ManObj(pAig, pSupp->pArray[c]) );
            pSuppF->DelayR = IVY_MIN( pSuppF->DelayR, pSupp->DelayR - 1 );
            pSuppF->nRefs++;
        }
    }
/*
    // print out some of the required times
    Ivy_ManForEachPi( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        printf( "%d ", pSupp->DelayR );
    }
    printf( "\n" );    
*/

    if ( fSetInter )
    {
        // set the required times of the intermediate nodes
        Vec_VecForEachLevelReverse( vLuts, vNodes, i )
        Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, k )
        {
            pSupp = Ivy_ObjSupp( pAig, pObj );
            Ivy_FastMapRequired_rec( pAig, pObj, pObj, pSupp->DelayR ); 
        }
        // make sure that all required times are assigned
        Ivy_ManForEachNode( pAig, pObj, i )
        {
            pSupp = Ivy_ObjSupp( pAig, pObj );
            assert( pSupp->DelayR < IVY_INFINITY );
        }
    }
}